

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_tobin.c
# Opt level: O2

int cfg_tobin_tokens(void *reference,char *value,cfg_schema_entry *entries,size_t entry_count,
                    cfg_schema_token_customizer *custom)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  const_strarray *pcVar3;
  const_strarray *pcVar4;
  size_t sVar5;
  const_strarray parameter;
  char buffer [256];
  
  parameter.value = buffer;
  pcVar4 = &entries->def;
  sVar5 = 1;
  __s = value;
  while( true ) {
    if (entry_count == sVar5) {
      if (__s != (char *)0x0) {
        parameter.value = __s;
        sVar2 = strlen(__s);
        parameter.length = sVar2 + 1;
        if ((entries[entry_count - 1].cb_to_binary !=
             (_func_int_cfg_schema_entry_ptr_const_strarray_ptr_void_ptr *)0x0) &&
           (iVar1 = (*entries[entry_count - 1].cb_to_binary)
                              (entries + (entry_count - 1),&parameter,
                               (void *)(entries[entry_count - 1].bin_offset + (long)reference)),
           iVar1 != 0)) {
          return -1;
        }
      }
      iVar1 = 0;
      if ((custom != (cfg_schema_token_customizer *)0x0) &&
         (custom->cb_tobin != (_func_int_cfg_schema_entry_ptr_size_t_char_ptr_void_ptr *)0x0)) {
        iVar1 = (*custom->cb_tobin)(entries,entry_count,value,reference);
      }
      return iVar1;
    }
    if (__s == (char *)0x0) {
      __s = (char *)0x0;
      pcVar3 = pcVar4;
    }
    else {
      __s = (char *)str_cpynextword(buffer,__s,0x100);
      sVar2 = strlen(parameter.value);
      parameter.length = sVar2 + 1;
      pcVar3 = &parameter;
    }
    if (((_func_int_cfg_schema_entry_ptr_const_strarray_ptr_void_ptr *)pcVar4[4].length !=
         (_func_int_cfg_schema_entry_ptr_const_strarray_ptr_void_ptr *)0x0) &&
       (iVar1 = (*(_func_int_cfg_schema_entry_ptr_const_strarray_ptr_void_ptr *)pcVar4[4].length)
                          ((cfg_schema_entry *)(pcVar4 + -5),pcVar3,
                           pcVar4[5].value + (long)reference), iVar1 != 0)) break;
    sVar5 = sVar5 + 1;
    pcVar4 = (const_strarray *)&pcVar4[0xc].length;
  }
  return -1;
}

Assistant:

int
cfg_tobin_tokens(void *reference, const char *value, struct cfg_schema_entry *entries, size_t entry_count,
  struct cfg_schema_token_customizer *custom) {
  struct const_strarray parameter, *parameter_ptr;
  const char *next_token;
  char buffer[256];
  char *dst;
  size_t i;

  dst = reference;
  next_token = value;

  parameter.value = buffer;
  for (i = 0; i < entry_count - 1; i++) {
    if (!next_token) {
      parameter_ptr = &entries[i].def;
    }
    else {
      next_token = str_cpynextword(buffer, next_token, sizeof(buffer));
      parameter.length = strlen(parameter.value) + 1;
      parameter_ptr = &parameter;
    }

    if (entries[i].cb_to_binary) {
      if (entries[i].cb_to_binary(&entries[i], parameter_ptr, dst + entries[i].bin_offset)) {
        return -1;
      }
    }
  }

  if (next_token) {
    /* we have data for the last entry left */
    i = entry_count - 1;

    parameter.value = next_token;
    parameter.length = strlen(next_token) + 1;

    if (entries[i].cb_to_binary) {
      if (entries[i].cb_to_binary(&entries[i], &parameter, dst + entries[i].bin_offset)) {
        return -1;
      }
    }
  }

  if (custom && custom->cb_tobin) {
    return custom->cb_tobin(entries, entry_count, value, dst);
  }
  return 0;
}